

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8_t *ptr,uint32_t offset,uint32_t param_3,uint32_t param_4,
               CodedOutputStream *output)

{
  undefined8 *puVar1;
  
  if ((*(ulong *)(ptr + offset) & 1) == 0) {
    InitProtobufDefaults();
    puVar1 = &fixed_address_empty_string;
  }
  else {
    puVar1 = (undefined8 *)((*(ulong *)(ptr + offset) & 0xfffffffffffffffe) + 8);
  }
  io::CodedOutputStream::WriteRaw(output,(void *)*puVar1,*(int *)(puVar1 + 1));
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8_t* ptr, uint32_t offset,
                                uint32_t /*tag*/, uint32_t /*has_offset*/,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}